

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O1

void Exp_Truth8(int nVars,Vec_Int_t *p,word **puFanins,word *puRes)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  long lVar5;
  ulong *__ptr;
  ulong *puVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  word wVar11;
  ulong *puVar12;
  ulong uVar13;
  uint uVar14;
  word *__dest;
  word *puFaninsInt [8];
  word Truth8 [8] [4];
  word *local_178 [8];
  word local_138 [33];
  
  __dest = local_138;
  memcpy(__dest,&DAT_009f0050,0x100);
  uVar14 = p->nSize;
  uVar13 = (ulong)uVar14;
  if ((int)uVar14 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  piVar4 = p->pArray;
  uVar1 = piVar4[uVar13 - 1];
  if (puFanins == (word **)0x0) {
    lVar5 = 0;
    puFanins = local_178;
    do {
      local_178[lVar5] = __dest;
      lVar5 = lVar5 + 1;
      __dest = __dest + 4;
    } while (lVar5 != 8);
  }
  if (uVar14 == 1) {
    if (SBORROW4(uVar1,nVars * 2) == (int)(uVar1 + nVars * -2) < 0) {
      __assert_fail("iRoot < 2 * nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mio/exp.h"
                    ,0xe3,"void Exp_Truth8(int, Vec_Int_t *, word **, word *)");
    }
    if (uVar1 < 0xfffffffe) {
      if ((int)uVar1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      lVar5 = 0;
      do {
        if ((uVar1 & 1) == 0) {
          wVar11 = puFanins[uVar1 >> 1][lVar5];
        }
        else {
          wVar11 = ~puFanins[uVar1 >> 1][lVar5];
        }
        puRes[lVar5] = wVar11;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
    }
    else {
      lVar5 = 0;
      do {
        puRes[lVar5] = -(ulong)(uVar1 != 0xffffffff);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
    }
  }
  else {
    uVar14 = uVar14 >> 1;
    __ptr = (ulong *)calloc((ulong)uVar14 * 4,8);
    uVar9 = 0;
    puVar10 = __ptr;
    do {
      puVar6 = puVar10;
      uVar8 = uVar9;
      if (uVar13 <= uVar8 * 2) {
LAB_0052cdca:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar2 = piVar4[uVar8 * 2];
      if ((int)uVar2 < 0) goto LAB_0052cdab;
      uVar9 = uVar8 * 2 | 1;
      if (uVar13 <= uVar9) goto LAB_0052cdca;
      uVar3 = piVar4[uVar9];
      if ((int)uVar3 < 0) goto LAB_0052cdab;
      uVar7 = uVar2 >> 1;
      if ((int)uVar7 < nVars) {
        puVar10 = puFanins[uVar7];
      }
      else {
        puVar10 = __ptr + (int)((uVar7 - nVars) * 4);
      }
      uVar7 = uVar3 >> 1;
      if ((int)uVar7 < nVars) {
        puVar12 = puFanins[uVar7];
      }
      else {
        puVar12 = __ptr + (int)((uVar7 - nVars) * 4);
      }
      if ((uVar2 & uVar3 & 1) == 0) {
        if (((uVar2 & 1) == 0) || ((uVar3 & 1) != 0)) {
          if (((uVar2 & 1) == 0) && ((uVar3 & 1) != 0)) {
            lVar5 = 0;
            do {
              puVar6[lVar5] = ~puVar12[lVar5] & puVar10[lVar5];
              lVar5 = lVar5 + 1;
            } while (lVar5 != 4);
          }
          else {
            lVar5 = 0;
            do {
              puVar6[lVar5] = puVar12[lVar5] & puVar10[lVar5];
              lVar5 = lVar5 + 1;
            } while (lVar5 != 4);
          }
        }
        else {
          lVar5 = 0;
          do {
            puVar6[lVar5] = ~puVar10[lVar5] & puVar12[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
        }
      }
      else {
        lVar5 = 0;
        do {
          puVar6[lVar5] = ~(puVar12[lVar5] | puVar10[lVar5]);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
      }
      uVar9 = uVar8 + 1;
      puVar10 = puVar6 + 4;
    } while (uVar8 + 1 != (ulong)(uVar14 + (uVar14 == 0)));
    if ((int)uVar1 < 0) {
LAB_0052cdab:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    if ((uVar1 >> 1) - nVars != (int)uVar8) {
      __assert_fail("Abc_Lit2Var(iRoot) - nVars == i - 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mio/exp.h"
                    ,0x103,"void Exp_Truth8(int, Vec_Int_t *, word **, word *)");
    }
    lVar5 = 0;
    do {
      puRes[lVar5] = *puVar6 ^ (long)(int)-(uVar1 & 1);
      lVar5 = lVar5 + 1;
      puVar6 = puVar6 + 1;
    } while (lVar5 != 4);
    if (__ptr != (ulong *)0x0) {
      free(__ptr);
    }
  }
  return;
}

Assistant:

static inline void Exp_Truth8( int nVars, Vec_Int_t * p, word ** puFanins, word * puRes )
{
    word Truth8[8][4] = {
        { ABC_CONST(0xAAAAAAAAAAAAAAAA),ABC_CONST(0xAAAAAAAAAAAAAAAA),ABC_CONST(0xAAAAAAAAAAAAAAAA),ABC_CONST(0xAAAAAAAAAAAAAAAA) },
        { ABC_CONST(0xCCCCCCCCCCCCCCCC),ABC_CONST(0xCCCCCCCCCCCCCCCC),ABC_CONST(0xCCCCCCCCCCCCCCCC),ABC_CONST(0xCCCCCCCCCCCCCCCC) },
        { ABC_CONST(0xF0F0F0F0F0F0F0F0),ABC_CONST(0xF0F0F0F0F0F0F0F0),ABC_CONST(0xF0F0F0F0F0F0F0F0),ABC_CONST(0xF0F0F0F0F0F0F0F0) },
        { ABC_CONST(0xFF00FF00FF00FF00),ABC_CONST(0xFF00FF00FF00FF00),ABC_CONST(0xFF00FF00FF00FF00),ABC_CONST(0xFF00FF00FF00FF00) },
        { ABC_CONST(0xFFFF0000FFFF0000),ABC_CONST(0xFFFF0000FFFF0000),ABC_CONST(0xFFFF0000FFFF0000),ABC_CONST(0xFFFF0000FFFF0000) },
        { ABC_CONST(0xFFFFFFFF00000000),ABC_CONST(0xFFFFFFFF00000000),ABC_CONST(0xFFFFFFFF00000000),ABC_CONST(0xFFFFFFFF00000000) },
        { ABC_CONST(0x0000000000000000),ABC_CONST(0xFFFFFFFFFFFFFFFF),ABC_CONST(0x0000000000000000),ABC_CONST(0xFFFFFFFFFFFFFFFF) },
        { ABC_CONST(0x0000000000000000),ABC_CONST(0x0000000000000000),ABC_CONST(0xFFFFFFFFFFFFFFFF),ABC_CONST(0xFFFFFFFFFFFFFFFF) }
    };
    word * puFaninsInt[8], * pStore, * pThis = NULL;
    int i, k, iRoot = Vec_IntEntryLast(p);
    if ( puFanins == NULL )
    {
        puFanins = puFaninsInt;
        for ( k = 0; k < 8; k++ )
            puFanins[k] = Truth8[k];
    }
    if ( Exp_NodeNum(p) == 0 )
    {
        assert( iRoot < 2 * nVars );
        if ( iRoot == EXP_CONST0 || iRoot == EXP_CONST1 )
            for ( k = 0; k < 4; k++ )
                puRes[k] = iRoot == EXP_CONST0 ? 0 : ~(word)0;
        else
            for ( k = 0; k < 4; k++ )
                puRes[k] = Abc_LitIsCompl(iRoot) ? ~puFanins[Abc_Lit2Var(iRoot)][k] : puFanins[Abc_Lit2Var(iRoot)][k];
        return;
    }
    pStore = ABC_CALLOC( word, 4 * Exp_NodeNum(p) );
    for ( i = 0; i < Exp_NodeNum(p); i++ )
    {
        int iVar0 = Abc_Lit2Var( Vec_IntEntry(p, 2*i+0) );
        int iVar1 = Abc_Lit2Var( Vec_IntEntry(p, 2*i+1) );
        int fCompl0 = Abc_LitIsCompl( Vec_IntEntry(p, 2*i+0) );
        int fCompl1 = Abc_LitIsCompl( Vec_IntEntry(p, 2*i+1) );
        word * pIn0 = iVar0 < nVars ? puFanins[iVar0] : pStore + 4 * (iVar0 - nVars);
        word * pIn1 = iVar1 < nVars ? puFanins[iVar1] : pStore + 4 * (iVar1 - nVars);
        pThis = pStore + 4 * i;
        if ( fCompl0 && fCompl1 )
            for ( k = 0; k < 4; k++ )
                pThis[k] = ~pIn0[k] & ~pIn1[k];
        else if ( fCompl0 && !fCompl1 )
            for ( k = 0; k < 4; k++ )
                pThis[k] = ~pIn0[k] &  pIn1[k];
        else if ( !fCompl0 && fCompl1 )
            for ( k = 0; k < 4; k++ )
                pThis[k] =  pIn0[k] & ~pIn1[k];
        else //if ( !fCompl0 && !fCompl1 )
            for ( k = 0; k < 4; k++ )
                pThis[k] =  pIn0[k] &  pIn1[k];
    }
    assert( Abc_Lit2Var(iRoot) - nVars == i - 1 );
    for ( k = 0; k < 4; k++ )
        puRes[k] = Abc_LitIsCompl(iRoot) ? ~pThis[k] : pThis[k];
    ABC_FREE( pStore );
}